

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

bool __thiscall GenericModel::setFlags(GenericModel *this,QModelIndex *index,ItemFlags flags)

{
  bool bVar1;
  GenericModelItem *pGVar2;
  QArrayDataPointer<int> local_38;
  
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    pGVar2 = GenericModelPrivate::itemForIndex(this->m_dptr,index);
    if ((pGVar2->flags).i != flags.i) {
      (pGVar2->flags).i = flags.i;
      local_38.d = (Data *)0x0;
      local_38.ptr = (int *)0x0;
      local_38.size = 0;
      QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_38);
    }
  }
  return bVar1;
}

Assistant:

bool GenericModel::setFlags(const QModelIndex &index, Qt::ItemFlags flags)
{
    if (!index.isValid())
        return false;
    Q_ASSERT(index.model() == this);
    Q_D(GenericModel);
    GenericModelItem *const item = d->itemForIndex(index);
    if (item->flags != flags) {
        item->flags = flags;
        dataChanged(index, index);
    }
    return true;
}